

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void * sk_getxdmdata(Socket *sock,int *lenp)

{
  uint uVar1;
  undefined1 uVar2;
  int iVar3;
  __pid_t _Var4;
  in_addr_t *piVar5;
  undefined1 *puVar6;
  uint8_t *p;
  socklen_t addrlen;
  sockaddr_union u;
  
  if (sock->vt == &NetSocket_sockvt) {
    addrlen = 0x80;
    iVar3 = getsockname(*(int *)&sock[-0x11].vt,(sockaddr *)&u.storage,&addrlen);
    if (-1 < iVar3) {
      if (u.storage.ss_family == 1) {
        *lenp = 6;
        puVar6 = (undefined1 *)safemalloc(6,1,0);
        uVar1 = sk_getxdmdata::unix_addr;
        uVar2 = (undefined1)sk_getxdmdata::unix_addr;
        sk_getxdmdata::unix_addr = sk_getxdmdata::unix_addr - 1;
        puVar6[3] = uVar2;
        puVar6[2] = (char)(uVar1 >> 8);
        puVar6[1] = (char)(uVar1 >> 0x10);
        *puVar6 = (char)(uVar1 >> 0x18);
        _Var4 = getpid();
        *(ushort *)(puVar6 + 4) = (ushort)_Var4 << 8 | (ushort)_Var4 >> 8;
        return puVar6;
      }
      if (u.storage.ss_family == 10) {
        *lenp = 6;
        piVar5 = (in_addr_t *)safemalloc(6,1,0);
        if (((u._8_4_ != 0) || (u._12_4_ != 0)) || (u._4_4_ = u._20_4_, u._16_4_ != -0x10000)) {
          *(undefined2 *)(piVar5 + 1) = 0;
          *piVar5 = 0;
          return piVar5;
        }
      }
      else {
        if (u.storage.ss_family != 2) {
          return (void *)0x0;
        }
        *lenp = 6;
        piVar5 = (in_addr_t *)safemalloc(6,1,0);
      }
      *piVar5 = (in_addr_t)u.sin.sin_addr.s_addr;
      *(in_port_t *)(piVar5 + 1) = u.sin.sin_port;
      return piVar5;
    }
  }
  return (void *)0x0;
}

Assistant:

void *sk_getxdmdata(Socket *sock, int *lenp)
{
    NetSocket *s;
    union sockaddr_union u;
    socklen_t addrlen;
    char *buf;
    static unsigned int unix_addr = 0xFFFFFFFF;

    /*
     * We must check that this socket really _is_ a NetSocket before
     * downcasting it.
     */
    if (sock->vt != &NetSocket_sockvt)
        return NULL;                   /* failure */
    s = container_of(sock, NetSocket, sock);

    addrlen = sizeof(u);
    if (getsockname(s->s, &u.sa, &addrlen) < 0)
        return NULL;
    switch(u.sa.sa_family) {
      case AF_INET:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, ntohl(u.sin.sin_addr.s_addr));
        PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin.sin_port));
        break;
#ifndef NO_IPV6
    case AF_INET6:
        *lenp = 6;
        buf = snewn(*lenp, char);
        if (IN6_IS_ADDR_V4MAPPED(&u.sin6.sin6_addr)) {
            memcpy(buf, u.sin6.sin6_addr.s6_addr + 12, 4);
            PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin6.sin6_port));
        } else
            /* This is stupid, but it's what XLib does. */
            memset(buf, 0, 6);
        break;
#endif
      case AF_UNIX:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, unix_addr--);
        PUT_16BIT_MSB_FIRST(buf+4, getpid());
        break;

        /* XXX IPV6 */

      default:
        return NULL;
    }

    return buf;
}